

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_cmd_ln.c
# Opt level: O2

int parse_cmd_ln(int argc,char **argv)

{
  cmd_ln_t *pcVar1;
  long lVar2;
  long lVar3;
  char examplestr [144];
  char helpstr [403];
  
  memcpy(helpstr,
         "Description: \n\n    This is an implementation of Dr. Rita Singh\'s automatic question \n    generation.  (Copied from Rita\'s comment) The current algorithm \n    clusters CI distributions using a hybrid bottom-up top-down \n    clustering algorithm to build linguistic questions for decision \n    trees.\n    (From Arthur : I need to do some tracing before understand it \n    what\'s the internal of the code)"
         ,0x193);
  memcpy(examplestr,
         "Example: \nmake_quest -moddeffn mdef -meanfn mean -varfn var -mixwfn \nmixwfn -npermute 8 -niter 1 -qstperstt 20 -questfn \nquestions -type .cont."
         ,0x90);
  cmd_ln_parse(parse_cmd_ln::defn,argc,argv,1);
  pcVar1 = cmd_ln_get();
  lVar2 = cmd_ln_int_r(pcVar1,"-help");
  pcVar1 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar1,"-example");
  if ((int)lVar2 != 0) {
    printf("%s\n\n",helpstr);
  }
  if ((int)lVar3 != 0) {
    printf("%s\n\n",examplestr);
  }
  if ((int)lVar3 == 0 && (int)lVar2 == 0) {
    return 0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/parse_cmd_ln.c"
          ,0xa7,"User asked for help or example.\n");
  exit(0);
}

Assistant:

int
parse_cmd_ln(int argc, char *argv[])
{
  uint32      isHelp;
  uint32      isExample;

    const char helpstr[] =  
"Description: \n\
\n\
    This is an implementation of Dr. Rita Singh's automatic question \n\
    generation.  (Copied from Rita's comment) The current algorithm \n\
    clusters CI distributions using a hybrid bottom-up top-down \n\
    clustering algorithm to build linguistic questions for decision \n\
    trees.\n\
    (From Arthur : I need to do some tracing before understand it \n\
    what's the internal of the code)";

    const char examplestr[] =
"Example: \n\
make_quest -moddeffn mdef -meanfn mean -varfn var -mixwfn \n\
mixwfn -npermute 8 -niter 1 -qstperstt 20 -questfn \n\
questions -type .cont.";


    static arg_t defn[] = {
	{ "-help",
	  ARG_BOOLEAN,
	  "no",
	  "Shows the usage of the tool"},

	{ "-example",
	  ARG_BOOLEAN,
	  "no",
	  "Shows example of how to use the tool"},

	{ "-moddeffn",
	  ARG_STRING,
	  NULL,
	  "Model definition file of the ci models" },

	{ "-meanfn",
	  ARG_STRING,
	  NULL,
	  "means file for tree building using continuous HMMs" },

	{ "-varfn",
	  ARG_STRING,
	  NULL,
	  "variances file for tree building using continuous HMMs" },

	{ "-fullvar",
	  ARG_BOOLEAN,
	  "no",
	  "variances file contains full covariances" },

        { "-varfloor",
          ARG_FLOAT32,
          "1.0e-08",
          "The minimum variance"},

	{ "-mixwfn",
	  ARG_STRING,
	  NULL,
	  "PDF's for tree building using semicontinuous HMMs" },

        { "-npermute",
          ARG_INT32,
          "6",
          "The minimum variance"},

        { "-niter",
          ARG_INT32,
          "0",
          "Number of iterations"},

        { "-qstperstt",
          ARG_INT32,
          "8",
          "something per state"},

	{ "-tempfn",
	  ARG_STRING,
	  "/tmp/TEMP.QUESTS",
	  "(Obsolete) File to write temprorary results to " },

	{ "-questfn",
	  ARG_STRING,
	  NULL,
	  "File to write questions to" },

	{ "-type",
	  ARG_STRING,
	  NULL,
	  "HMM type" },

	{NULL, 0, NULL, NULL}

    };

    cmd_ln_parse(defn, argc, argv, 1);

    isHelp    = cmd_ln_int32("-help");
    isExample    = cmd_ln_int32("-example");

    if(isHelp){
      printf("%s\n\n",helpstr);
    }

    if(isExample){
      printf("%s\n\n",examplestr);
    }

    if(isHelp || isExample){
      E_INFO("User asked for help or example.\n");
      exit(0);
    }


    return 0;
}